

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDefinition.cpp
# Opt level: O2

bool __thiscall
Rml::PropertyDefinition::GetValue(PropertyDefinition *this,String *value,Property *property)

{
  Unit UVar1;
  NodePtr pDVar2;
  int iVar3;
  PropertyParser *pPVar4;
  ulong uVar5;
  pointer pPVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  allocator<char> local_99;
  const_iterator __begin3;
  String local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  Variant::Get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3,
             &property->value,&local_50);
  ::std::__cxx11::string::operator=((string *)value,(string *)&__begin3);
  ::std::__cxx11::string::~string((string *)&__begin3);
  ::std::__cxx11::string::~string((string *)&local_50);
  UVar1 = property->unit;
  if (UVar1 != KEYWORD) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    ToString<Rml::Unit>((String *)&__begin3,&property->unit,&local_70);
    ::std::__cxx11::string::append((string *)value);
    ::std::__cxx11::string::~string((string *)&__begin3);
    ::std::__cxx11::string::~string((string *)&local_70);
    goto LAB_002ae3b9;
  }
  iVar7 = property->parser_index;
  if ((iVar7 < 0) ||
     ((int)(((long)(this->parsers).
                   super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->parsers).
                  super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x38) <= iVar7)) {
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&__begin3,"keyword",&local_99);
    pPVar4 = StyleSheetSpecification::GetParser((String *)&__begin3);
    ::std::__cxx11::string::~string((string *)&__begin3);
    pPVar6 = (this->parsers).
             super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->parsers).
                   super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar6) / 0x38;
    uVar8 = 0;
    iVar3 = (int)uVar5;
    uVar9 = 0;
    if (0 < iVar3) {
      uVar9 = uVar5 & 0xffffffff;
    }
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      if (pPVar6->parser == pPVar4) {
        iVar7 = (int)uVar8;
        goto LAB_002ae358;
      }
      pPVar6 = pPVar6 + 1;
    }
    if (iVar7 < 0) goto LAB_002ae3b9;
LAB_002ae358:
    if (iVar3 <= iVar7) goto LAB_002ae3b9;
  }
  iVar3 = Variant::Get<int>(&property->value,0);
  pPVar6 = (this->parsers).
           super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __begin3 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::cbegin(&pPVar6[iVar7].parameters);
  pDVar2 = (NodePtr)pPVar6[iVar7].parameters.mInfo;
  while (__begin3.mKeyVals != pDVar2) {
    if (((__begin3.mKeyVals)->mData).second == iVar3) {
      ::std::__cxx11::string::_M_assign((string *)value);
      break;
    }
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Iter<true>::operator++(&__begin3);
  }
LAB_002ae3b9:
  return UVar1 != KEYWORD;
}

Assistant:

bool PropertyDefinition::GetValue(String& value, const Property& property) const
{
	value = property.value.Get<String>();

	switch (property.unit)
	{
	case Unit::KEYWORD:
	{
		int parser_index = property.parser_index;
		if (parser_index < 0 || parser_index >= (int)parsers.size())
		{
			// Look for the keyword parser in the property's list of parsers
			const auto* keyword_parser = StyleSheetSpecification::GetParser("keyword");
			for (int i = 0; i < (int)parsers.size(); i++)
			{
				if (parsers[i].parser == keyword_parser)
				{
					parser_index = i;
					break;
				}
			}
			// If we couldn't find it, exit now
			if (parser_index < 0 || parser_index >= (int)parsers.size())
				return false;
		}

		int keyword = property.value.Get<int>();
		for (const auto& name_keyword : parsers[parser_index].parameters)
		{
			if (name_keyword.second == keyword)
			{
				value = name_keyword.first;
				break;
			}
		}

		return false;
	}
	break;

	default: value += ToString(property.unit); break;
	}

	return true;
}